

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)4,(moira::Mode)3,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  byte bVar3;
  Imd im;
  Ea<(moira::Mode)3,_1> dst;
  
  dst.reg = op & 7;
  dst.pc = *addr;
  bVar3 = 8;
  if ((op & 0xe00) != 0) {
    bVar3 = (byte)(op >> 9) & 7;
  }
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  im.raw._1_3_ = 0;
  im.raw._0_1_ = bVar3;
  if (SVar1 == MUSASHI) {
    StrWriter::operator<<(pSVar2,im);
  }
  else {
    pSVar2 = StrWriter::operator<<(pSVar2,(Ims<1>)im.raw);
  }
  StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,&dst);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src =          ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << dst;
    }
}